

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

NodeChildIterator * ts_node_iterate_children(NodeChildIterator *__return_storage_ptr__,TSNode *node)

{
  TSNode self;
  TSNode self_00;
  TSNode self_01;
  uint32_t uVar1;
  Subtree self_02;
  TSSymbol *pTVar2;
  TSPoint TVar3;
  Length LVar4;
  TSTree *in_stack_ffffffffffffffb8;
  TSSymbol *alias_sequence;
  uint32_t local_20;
  Subtree subtree;
  TSNode *node_local;
  
  self.tree = in_stack_ffffffffffffffb8;
  self._0_24_ = *(undefined1 (*) [24])(node->context + 2);
  self_02 = ts_node__subtree(self);
  uVar1 = ts_subtree_child_count(self_02);
  if (uVar1 == 0) {
    (__return_storage_ptr__->parent).ptr = (SubtreeHeapData *)0x0;
    __return_storage_ptr__->tree = node->tree;
    LVar4 = length_zero();
    alias_sequence = LVar4._0_8_;
    *(TSSymbol **)&__return_storage_ptr__->position = alias_sequence;
    local_20 = LVar4.extent.column;
    (__return_storage_ptr__->position).extent.column = local_20;
    __return_storage_ptr__->child_index = 0;
    __return_storage_ptr__->structural_child_index = 0;
    __return_storage_ptr__->alias_sequence = (TSSymbol *)0x0;
  }
  else {
    pTVar2 = ts_language_alias_sequence
                       (node->tree->language,
                        (uint)((self_02.ptr)->field_17).field_0.alias_sequence_id);
    __return_storage_ptr__->parent = self_02;
    __return_storage_ptr__->tree = node->tree;
    self_00.tree = in_stack_ffffffffffffffb8;
    self_00._0_24_ = *(undefined1 (*) [24])(node->context + 2);
    uVar1 = ts_node_start_byte(self_00);
    (__return_storage_ptr__->position).bytes = uVar1;
    self_01.tree = in_stack_ffffffffffffffb8;
    self_01._0_24_ = *(undefined1 (*) [24])(node->context + 2);
    TVar3 = ts_node_start_point(self_01);
    (__return_storage_ptr__->position).extent = TVar3;
    __return_storage_ptr__->child_index = 0;
    __return_storage_ptr__->structural_child_index = 0;
    __return_storage_ptr__->alias_sequence = pTVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline NodeChildIterator ts_node_iterate_children(const TSNode *node) {
  Subtree subtree = ts_node__subtree(*node);
  if (ts_subtree_child_count(subtree) == 0) {
    return (NodeChildIterator) {NULL_SUBTREE, node->tree, length_zero(), 0, 0, NULL};
  }
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    node->tree->language,
    subtree.ptr->alias_sequence_id
  );
  return (NodeChildIterator) {
    .tree = node->tree,
    .parent = subtree,
    .position = {ts_node_start_byte(*node), ts_node_start_point(*node)},
    .child_index = 0,
    .structural_child_index = 0,
    .alias_sequence = alias_sequence,
  };
}